

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

HttpSender * __thiscall sensors_analytics::HttpSender::Base64Encode(HttpSender *this,string *data)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  byte local_3b [4];
  byte local_37 [3];
  undefined1 uStack_34;
  uchar char_array_4 [4];
  uchar char_array_3 [3];
  int j;
  int i;
  size_t in_len;
  uchar *bytes_to_encode;
  string *data_local;
  string *ret;
  
  in_len = std::__cxx11::string::data();
  _i = std::__cxx11::string::length();
  std::__cxx11::string::string((string *)this);
  stack0xffffffffffffffd0 = 0;
  _uStack_34 = 0;
  while (iVar1 = stack0xffffffffffffffd0, lVar2 = _i + -1, _i != 0) {
    sVar3 = in_len + 1;
    register0x00000010 = stack0xffffffffffffffd0 + 1;
    local_37[iVar1] = *(byte *)in_len;
    _i = lVar2;
    in_len = sVar3;
    if (register0x00000010 == 3) {
      local_3b[0] = (byte)((int)(local_37[0] & 0xfc) >> 2);
      local_3b[1] = (local_37[0] & 3) * '\x10' + (char)((int)(local_37[1] & 0xf0) >> 4);
      local_3b[2] = (local_37[1] & 0xf) * '\x04' + (char)((int)(local_37[2] & 0xc0) >> 6);
      local_3b[3] = local_37[2] & 0x3f;
      for (stack0xffffffffffffffd0 = 0; stack0xffffffffffffffd0 < 4;
          stack0xffffffffffffffd0 = stack0xffffffffffffffd0 + 1) {
        std::__cxx11::string::operator+=
                  ((string *)this,
                   "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                   [local_3b[stack0xffffffffffffffd0]]);
      }
      stack0xffffffffffffffd0 = 0;
    }
  }
  if (stack0xffffffffffffffd0 != 0) {
    for (_uStack_34 = stack0xffffffffffffffd0; _uStack_34 < 3; _uStack_34 = _uStack_34 + 1) {
      local_37[_uStack_34] = 0;
    }
    local_3b[0] = (byte)((int)(local_37[0] & 0xfc) >> 2);
    local_3b[1] = (local_37[0] & 3) * '\x10' + (char)((int)(local_37[1] & 0xf0) >> 4);
    local_3b[2] = (local_37[1] & 0xf) * '\x04' + (char)((int)(local_37[2] & 0xc0) >> 6);
    local_3b[3] = local_37[2] & 0x3f;
    for (_uStack_34 = 0; _uStack_34 < stack0xffffffffffffffd0 + 1; _uStack_34 = _uStack_34 + 1) {
      std::__cxx11::string::operator+=
                ((string *)this,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [local_3b[_uStack_34]]);
    }
    while (stack0xffffffffffffffd0 < 3) {
      unique0x1000014b = stack0xffffffffffffffd0 + 1;
      std::__cxx11::string::operator+=((string *)this,'=');
    }
  }
  return this;
}

Assistant:

std::string HttpSender::Base64Encode(const string &data) {
  const unsigned char
      *bytes_to_encode = reinterpret_cast<const unsigned char *>(data.data());
  size_t in_len = data.length();
  std::string ret;
  int i = 0;
  int j = 0;
  unsigned char char_array_3[3];
  unsigned char char_array_4[4];

  while (in_len-- > 0) {
    char_array_3[i++] = *(bytes_to_encode++);
    if (i == 3) {
      char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
      char_array_4[1] =
          ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
      char_array_4[2] =
          ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
      char_array_4[3] = char_array_3[2] & 0x3f;

      for (i = 0; (i < 4); i++)
        ret += kBase64Chars[char_array_4[i]];
      i = 0;
    }
  }

  if (i != 0) {
    for (j = i; j < 3; j++)
      char_array_3[j] = '\0';
    char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
    char_array_4[1] =
        ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
    char_array_4[2] =
        ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
    char_array_4[3] = char_array_3[2] & 0x3f;
    for (j = 0; (j < i + 1); j++)
      ret += kBase64Chars[char_array_4[j]];
    while ((i++ < 3))
      ret += '=';
  }
  return ret;
}